

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

int32_t __thiscall
icu_63::Edits::Iterator::findIndex(Iterator *this,int32_t i,UBool findSource,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int local_64;
  int local_60;
  int32_t n_1;
  int32_t len_1;
  int32_t n;
  int32_t len;
  int32_t num;
  int32_t u;
  int32_t iStack_2c;
  UBool hasPrevious;
  int32_t spanLength;
  int32_t spanStart;
  UErrorCode *errorCode_local;
  UBool findSource_local;
  int32_t i_local;
  Iterator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if ((UVar1 == '\0') && (-1 < i)) {
    if (findSource == '\0') {
      iStack_2c = this->destIndex;
      u = this->newLength_;
    }
    else {
      iStack_2c = this->srcIndex;
      u = this->oldLength_;
    }
    if (i < iStack_2c) {
      if (iStack_2c / 2 <= i) {
        while( true ) {
          do {
            previous(this,errorCode);
            if (findSource == '\0') {
              local_60 = this->destIndex;
            }
            else {
              local_60 = this->srcIndex;
            }
            if (local_60 <= i) {
              return 0;
            }
          } while (this->remaining < 1);
          if (findSource == '\0') {
            local_64 = this->newLength_;
          }
          else {
            local_64 = this->oldLength_;
          }
          iVar2 = ((this->array[this->index] & 0x1ff) + 1) - this->remaining;
          if (local_60 - iVar2 * local_64 <= i) break;
          this->srcIndex = this->srcIndex - iVar2 * this->oldLength_;
          this->replIndex = this->replIndex - iVar2 * this->newLength_;
          this->destIndex = this->destIndex - iVar2 * this->newLength_;
          this->remaining = 0;
        }
        iVar2 = ((local_60 - i) + -1) / local_64 + 1;
        this->srcIndex = this->srcIndex - iVar2 * this->oldLength_;
        this->replIndex = this->replIndex - iVar2 * this->newLength_;
        this->destIndex = this->destIndex - iVar2 * this->newLength_;
        this->remaining = iVar2 + this->remaining;
        return 0;
      }
      this->dir = '\0';
      this->destIndex = 0;
      this->replIndex = 0;
      this->srcIndex = 0;
      this->newLength_ = 0;
      this->oldLength_ = 0;
      this->remaining = 0;
      this->index = 0;
    }
    else if (i < iStack_2c + u) {
      return 0;
    }
    while (UVar1 = next(this,'\0',errorCode), UVar1 != '\0') {
      if (findSource == '\0') {
        iStack_2c = this->destIndex;
        u = this->newLength_;
      }
      else {
        iStack_2c = this->srcIndex;
        u = this->oldLength_;
      }
      if (i < iStack_2c + u) {
        return 0;
      }
      if (1 < this->remaining) {
        if (i < iStack_2c + this->remaining * u) {
          iVar2 = (i - iStack_2c) / u;
          this->srcIndex = iVar2 * this->oldLength_ + this->srcIndex;
          this->replIndex = iVar2 * this->newLength_ + this->replIndex;
          this->destIndex = iVar2 * this->newLength_ + this->destIndex;
          this->remaining = this->remaining - iVar2;
          return 0;
        }
        this->oldLength_ = this->remaining * this->oldLength_;
        this->newLength_ = this->remaining * this->newLength_;
        this->remaining = 0;
      }
    }
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t Edits::Iterator::findIndex(int32_t i, UBool findSource, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode) || i < 0) { return -1; }
    int32_t spanStart, spanLength;
    if (findSource) {  // find source index
        spanStart = srcIndex;
        spanLength = oldLength_;
    } else {  // find destination index
        spanStart = destIndex;
        spanLength = newLength_;
    }
    if (i < spanStart) {
        if (i >= (spanStart / 2)) {
            // Search backwards.
            for (;;) {
                UBool hasPrevious = previous(errorCode);
                U_ASSERT(hasPrevious);  // because i>=0 and the first span starts at 0
                (void)hasPrevious;  // avoid unused-variable warning
                spanStart = findSource ? srcIndex : destIndex;
                if (i >= spanStart) {
                    // The index is in the current span.
                    return 0;
                }
                if (remaining > 0) {
                    // Is the index in one of the remaining compressed edits?
                    // spanStart is the start of the current span, first of the remaining ones.
                    spanLength = findSource ? oldLength_ : newLength_;
                    int32_t u = array[index];
                    U_ASSERT(MAX_UNCHANGED < u && u <= MAX_SHORT_CHANGE);
                    int32_t num = (u & SHORT_CHANGE_NUM_MASK) + 1 - remaining;
                    int32_t len = num * spanLength;
                    if (i >= (spanStart - len)) {
                        int32_t n = ((spanStart - i - 1) / spanLength) + 1;
                        // 1 <= n <= num
                        srcIndex -= n * oldLength_;
                        replIndex -= n * newLength_;
                        destIndex -= n * newLength_;
                        remaining += n;
                        return 0;
                    }
                    // Skip all of these edits at once.
                    srcIndex -= num * oldLength_;
                    replIndex -= num * newLength_;
                    destIndex -= num * newLength_;
                    remaining = 0;
                }
            }
        }
        // Reset the iterator to the start.
        dir = 0;
        index = remaining = oldLength_ = newLength_ = srcIndex = replIndex = destIndex = 0;
    } else if (i < (spanStart + spanLength)) {
        // The index is in the current span.
        return 0;
    }
    while (next(FALSE, errorCode)) {
        if (findSource) {
            spanStart = srcIndex;
            spanLength = oldLength_;
        } else {
            spanStart = destIndex;
            spanLength = newLength_;
        }
        if (i < (spanStart + spanLength)) {
            // The index is in the current span.
            return 0;
        }
        if (remaining > 1) {
            // Is the index in one of the remaining compressed edits?
            // spanStart is the start of the current span, first of the remaining ones.
            int32_t len = remaining * spanLength;
            if (i < (spanStart + len)) {
                int32_t n = (i - spanStart) / spanLength;  // 1 <= n <= remaining - 1
                srcIndex += n * oldLength_;
                replIndex += n * newLength_;
                destIndex += n * newLength_;
                remaining -= n;
                return 0;
            }
            // Make next() skip all of these edits at once.
            oldLength_ *= remaining;
            newLength_ *= remaining;
            remaining = 0;
        }
    }
    return 1;
}